

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O0

bool __thiscall
bloaty::ArgParser::TryParseUint64Option(ArgParser *this,string_view flag,uint64_t *val)

{
  bool bVar1;
  unsigned_long_long uVar2;
  unsigned_long_long *in_RCX;
  string_view *in_RDX;
  undefined8 in_RSI;
  string_view in_stack_00000000;
  string_view val_str;
  size_t *in_stack_fffffffffffffea8;
  string *in_stack_fffffffffffffeb0;
  allocator<char> *in_stack_fffffffffffffee0;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffee8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef0;
  allocator<char> local_69;
  string local_68 [32];
  undefined8 local_48;
  basic_string_view<char,_std::char_traits<char>_> local_38;
  unsigned_long_long *local_28;
  undefined8 local_18;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  local_28 = in_RCX;
  local_18 = in_RSI;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_38);
  local_48 = local_18;
  bVar1 = TryParseOption((ArgParser *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                         in_stack_00000000,in_RDX);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
    uVar2 = std::__cxx11::stoull(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,0);
    *local_28 = uVar2;
    std::__cxx11::string::~string(local_68);
    std::allocator<char>::~allocator(&local_69);
  }
  return bVar1;
}

Assistant:

bool TryParseUint64Option(string_view flag, uint64_t* val) {
    string_view val_str;
    if (!TryParseOption(flag, &val_str)) {
      return false;
    }

    try {
      *val = std::stoull(std::string(val_str), nullptr, 0);
    } catch (...) {
      THROWF("option '$0' had non-integral argument: $1", flag, val_str);
    }

    return true;
  }